

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

void __thiscall
immutable::ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_>::~ref
          (ref<immutable::rrb_details::tree_node<immutable::vector<char,_false,_5>,_true>_> *this)

{
  atomic<unsigned_int> *paVar1;
  internal_node<immutable::vector<char,_false,_5>,_true> *p_node;
  long lVar2;
  ulong uVar3;
  
  p_node = (internal_node<immutable::vector<char,_false,_5>,_true> *)this->ptr;
  if (p_node != (internal_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
    if (p_node->type == LEAF_NODE) {
      LOCK();
      paVar1 = &p_node->_ref_count;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        if (p_node->len != 0) {
          lVar2 = 0;
          uVar3 = 0;
          do {
            ref<immutable::rrb<char,_false,_5>_>::~ref
                      ((ref<immutable::rrb<char,_false,_5>_> *)
                       ((long)&((p_node->size_table).ptr)->size + lVar2));
            uVar3 = uVar3 + 1;
            lVar2 = lVar2 + 8;
          } while (uVar3 < p_node->len);
        }
        free(p_node);
        return;
      }
    }
    else {
      rrb_details::release<immutable::vector<char,false,5>>(p_node);
    }
  }
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }